

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttload.c
# Opt level: O2

FT_Error tt_face_load_name(TT_Face face,FT_Stream stream)

{
  TT_NameTableRec *structure;
  FT_UInt16 FVar1;
  uint uVar2;
  FT_ULong FVar3;
  TT_LangTagRec *P;
  FT_Pointer block;
  TT_NameRec *pTVar4;
  ulong uVar5;
  FT_Pointer structure_00;
  FT_Memory memory;
  FT_UInt FVar6;
  ulong uVar7;
  TT_LangTagRec *pTVar8;
  TT_LangTagRec *structure_01;
  bool bVar9;
  FT_Error error;
  ulong local_60;
  FT_ULong local_58;
  FT_Memory local_50;
  TT_NameTableRec *local_48;
  ulong local_40;
  FT_ULong table_len;
  
  memory = stream->memory;
  (face->name_table).stream = stream;
  error = (*face->goto_table)(face,0x6e616d65,stream,&table_len);
  if (error == 0) {
    structure = &face->name_table;
    FVar3 = FT_Stream_Pos(stream);
    error = FT_Stream_ReadFields(stream,tt_face_load_name::name_table_fields,structure);
    if (error == 0) {
      uVar2 = (face->name_table).numNameRecords;
      uVar7 = uVar2 * 0xc + FVar3 + 6;
      local_40 = table_len + FVar3;
      if (local_40 < uVar7) {
        error = 0x91;
      }
      else if (structure->format == 1) {
        error = FT_Stream_Seek(stream,uVar7);
        if (error == 0) {
          local_60 = uVar7;
          FVar1 = FT_Stream_ReadUShort(stream,&error);
          uVar2 = (uint)FVar1;
          (face->name_table).numLangTagRecords = uVar2;
          if (error == 0) {
            block = (void *)0x0;
            local_58 = FVar3;
            local_48 = structure;
            P = (TT_LangTagRec *)ft_mem_qrealloc(memory,0x18,0,(ulong)uVar2,(void *)0x0,&error);
            if (error != 0) goto LAB_0020640b;
            error = FT_Stream_EnterFrame(stream,(ulong)((face->name_table).numLangTagRecords << 2));
            if (error != 0) {
              block = (void *)0x0;
              goto LAB_0020640b;
            }
            if (P == (TT_LangTagRec *)0x0) {
              pTVar8 = (TT_LangTagRec *)0x0;
            }
            else {
              pTVar8 = P + (face->name_table).numLangTagRecords;
            }
            local_50 = (FT_Memory)(local_58 + 6);
            local_60 = local_60 + (ulong)uVar2 * 4 + 2;
            error = 0;
            for (structure_01 = P; structure_01 < pTVar8; structure_01 = structure_01 + 1) {
              error = FT_Stream_ReadFields
                                (stream,tt_face_load_name::langTag_record_fields,structure_01);
              uVar7 = (face->name_table).storageOffset + local_58 + structure_01->stringOffset;
              structure_01->stringOffset = uVar7;
              if ((uVar7 < local_60) || (local_40 < uVar7 + structure_01->stringLength)) {
                structure_01->stringLength = 0;
              }
              structure_01->string = (FT_Byte *)0x0;
            }
            (face->name_table).langTags = P;
            FT_Stream_ExitFrame(stream);
            error = FT_Stream_Seek(stream,(FT_ULong)local_50);
            uVar2 = (face->name_table).numNameRecords;
            uVar7 = local_60;
            FVar3 = local_58;
            structure = local_48;
            goto LAB_002062ca;
          }
        }
      }
      else {
LAB_002062ca:
        local_48 = structure;
        local_58 = FVar3;
        local_60 = uVar7;
        P = (TT_LangTagRec *)0x0;
        block = ft_mem_qrealloc(memory,0x20,0,(ulong)uVar2,(void *)0x0,&error);
        if (error != 0) goto LAB_0020640b;
        error = FT_Stream_EnterFrame(stream,(ulong)((face->name_table).numNameRecords * 0xc));
        uVar7 = 0;
        P = (TT_LangTagRec *)0x0;
        if (error != 0) goto LAB_0020640b;
        FVar6 = (face->name_table).numNameRecords;
        structure_00 = block;
        local_50 = memory;
        while( true ) {
          memory = local_50;
          bVar9 = FVar6 == 0;
          FVar6 = FVar6 - 1;
          if (bVar9) break;
          error = FT_Stream_ReadFields(stream,tt_face_load_name::name_record_fields,structure_00);
          if ((error == 0) && ((ulong)*(ushort *)((long)structure_00 + 8) != 0)) {
            uVar5 = (face->name_table).storageOffset + local_58 +
                    *(long *)((long)structure_00 + 0x10);
            *(ulong *)((long)structure_00 + 0x10) = uVar5;
            if (((local_60 <= uVar5) && (uVar5 + *(ushort *)((long)structure_00 + 8) <= local_40))
               && (((local_48->format != 1 || (-1 < (short)*(ushort *)((long)structure_00 + 4))) ||
                   ((uVar2 = *(ushort *)((long)structure_00 + 4) - 0x8000,
                    uVar2 < (face->name_table).numLangTagRecords &&
                    ((face->name_table).langTags[uVar2].stringLength != 0)))))) {
              *(undefined8 *)((long)structure_00 + 0x18) = 0;
              uVar7 = (ulong)((FT_UInt)uVar7 + 1);
              structure_00 = (FT_Pointer)((long)structure_00 + 0x20);
            }
          }
        }
        pTVar4 = (TT_NameRec *)
                 ft_mem_qrealloc(local_50,0x20,(ulong)(face->name_table).numNameRecords,uVar7,block,
                                 &error);
        (face->name_table).names = pTVar4;
        (face->name_table).numNameRecords = (FT_UInt)uVar7;
        FT_Stream_ExitFrame(stream);
        face->num_names = (FT_UShort)(face->name_table).numNameRecords;
      }
    }
  }
  block = (void *)0x0;
  P = (TT_LangTagRec *)0x0;
LAB_0020640b:
  ft_mem_free(memory,block);
  ft_mem_free(memory,P);
  return error;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_load_name( TT_Face    face,
                     FT_Stream  stream )
  {
    FT_Error      error;
    FT_Memory     memory = stream->memory;
    FT_ULong      table_pos, table_len;
    FT_ULong      storage_start, storage_limit;
    TT_NameTable  table;
    TT_Name       names    = NULL;
    TT_LangTag    langTags = NULL;

    static const FT_Frame_Field  name_table_fields[] =
    {
#undef  FT_STRUCTURE
#define FT_STRUCTURE  TT_NameTableRec

      FT_FRAME_START( 6 ),
        FT_FRAME_USHORT( format ),
        FT_FRAME_USHORT( numNameRecords ),
        FT_FRAME_USHORT( storageOffset ),
      FT_FRAME_END
    };

    static const FT_Frame_Field  name_record_fields[] =
    {
#undef  FT_STRUCTURE
#define FT_STRUCTURE  TT_NameRec

      /* no FT_FRAME_START */
        FT_FRAME_USHORT( platformID ),
        FT_FRAME_USHORT( encodingID ),
        FT_FRAME_USHORT( languageID ),
        FT_FRAME_USHORT( nameID ),
        FT_FRAME_USHORT( stringLength ),
        FT_FRAME_USHORT( stringOffset ),
      FT_FRAME_END
    };

    static const FT_Frame_Field  langTag_record_fields[] =
    {
#undef  FT_STRUCTURE
#define FT_STRUCTURE  TT_LangTagRec

      /* no FT_FRAME_START */
        FT_FRAME_USHORT( stringLength ),
        FT_FRAME_USHORT( stringOffset ),
      FT_FRAME_END
    };


    table         = &face->name_table;
    table->stream = stream;

    error = face->goto_table( face, TTAG_name, stream, &table_len );
    if ( error )
      goto Exit;

    table_pos = FT_STREAM_POS();

    if ( FT_STREAM_READ_FIELDS( name_table_fields, table ) )
      goto Exit;

    /* Some popular Asian fonts have an invalid `storageOffset' value (it */
    /* should be at least `6 + 12*numNameRecords').  However, the string  */
    /* offsets, computed as `storageOffset + entry->stringOffset', are    */
    /* valid pointers within the name table...                            */
    /*                                                                    */
    /* We thus can't check `storageOffset' right now.                     */
    /*                                                                    */
    storage_start = table_pos + 6 + 12 * table->numNameRecords;
    storage_limit = table_pos + table_len;

    if ( storage_start > storage_limit )
    {
      FT_ERROR(( "tt_face_load_name: invalid `name' table\n" ));
      error = FT_THROW( Name_Table_Missing );
      goto Exit;
    }

    /* `name' format 1 contains additional language tag records, */
    /* which we load first                                       */
    if ( table->format == 1 )
    {
      if ( FT_STREAM_SEEK( storage_start )            ||
           FT_READ_USHORT( table->numLangTagRecords ) )
        goto Exit;

      storage_start += 2 + 4 * table->numLangTagRecords;

      /* allocate language tag records array */
      if ( FT_QNEW_ARRAY( langTags, table->numLangTagRecords ) ||
           FT_FRAME_ENTER( table->numLangTagRecords * 4 )      )
        goto Exit;

      /* load language tags */
      {
        TT_LangTag  entry = langTags;
        TT_LangTag  limit = FT_OFFSET( entry, table->numLangTagRecords );


        for ( ; entry < limit; entry++ )
        {
          (void)FT_STREAM_READ_FIELDS( langTag_record_fields, entry );

          /* check that the langTag string is within the table */
          entry->stringOffset += table_pos + table->storageOffset;
          if ( entry->stringOffset                       < storage_start ||
               entry->stringOffset + entry->stringLength > storage_limit )
          {
            /* invalid entry; ignore it */
            entry->stringLength = 0;
          }

          /* mark the string as not yet loaded */
          entry->string = NULL;
        }

        table->langTags = langTags;
        langTags        = NULL;
      }

      FT_FRAME_EXIT();

      (void)FT_STREAM_SEEK( table_pos + 6 );
    }

    /* allocate name records array */
    if ( FT_QNEW_ARRAY( names, table->numNameRecords ) ||
         FT_FRAME_ENTER( table->numNameRecords * 12 )  )
      goto Exit;

    /* load name records */
    {
      TT_Name  entry = names;
      FT_UInt  count = table->numNameRecords;
      FT_UInt  valid = 0;


      for ( ; count > 0; count-- )
      {
        if ( FT_STREAM_READ_FIELDS( name_record_fields, entry ) )
          continue;

        /* check that the name is not empty */
        if ( entry->stringLength == 0 )
          continue;

        /* check that the name string is within the table */
        entry->stringOffset += table_pos + table->storageOffset;
        if ( entry->stringOffset                       < storage_start ||
             entry->stringOffset + entry->stringLength > storage_limit )
        {
          /* invalid entry; ignore it */
          continue;
        }

        /* assure that we have a valid language tag ID, and   */
        /* that the corresponding langTag entry is valid, too */
        if ( table->format == 1 && entry->languageID >= 0x8000U )
        {
          if ( entry->languageID - 0x8000U >= table->numLangTagRecords    ||
               !table->langTags[entry->languageID - 0x8000U].stringLength )
          {
            /* invalid entry; ignore it */
            continue;
          }
        }

        /* mark the string as not yet converted */
        entry->string = NULL;

        valid++;
        entry++;
      }

      /* reduce array size to the actually used elements */
      FT_MEM_QRENEW_ARRAY( names,
                           table->numNameRecords,
                           valid );
      table->names          = names;
      names                 = NULL;
      table->numNameRecords = valid;
    }

    FT_FRAME_EXIT();

    /* everything went well, update face->num_names */
    face->num_names = (FT_UShort)table->numNameRecords;

  Exit:
    FT_FREE( names );
    FT_FREE( langTags );
    return error;
  }